

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::ResetMemory(void)

{
  ClearMemory();
  Tree<NULLC::Range>::reset((Tree<NULLC::Range> *)bigBlocks);
  FastVector<NULLC::Range,_false,_false>::reset
            ((FastVector<NULLC::Range,_false,_false> *)blocksToFinalize);
  FastVector<NULLC::Range,_false,_false>::reset
            ((FastVector<NULLC::Range,_false,_false> *)blocksToFree);
  FastVector<NULLCRef,_false,_false>::reset((FastVector<NULLCRef,_false,_false> *)&finalizeList);
  GC::ResetGC();
  return;
}

Assistant:

void NULLC::ResetMemory()
{
	ClearMemory();

	bigBlocks.reset();

	blocksToFinalize.reset();
	blocksToFree.reset();

	finalizeList.reset();

	GC::ResetGC();
}